

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O0

void __thiscall
pbrt::ProjectiveCamera::ProjectiveCamera
          (ProjectiveCamera *this,CameraBaseParameters *baseParameters,Transform *screenFromCamera,
          Bounds2f screenWindow,Float lensRadius,Float focalDistance)

{
  Vector3f delta;
  undefined1 (*in_RDX) [64];
  CameraBaseParameters *in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  Float in_XMM2_Da;
  Float in_XMM3_Da;
  Transform rasterFromNDC;
  Transform NDCFromScreen;
  CameraBaseParameters *this_00;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  CameraBase *in_stack_fffffffffffff850;
  Transform *in_stack_fffffffffffff8c8;
  Transform *in_stack_fffffffffffff8d0;
  Float in_stack_fffffffffffff90c;
  Float in_stack_fffffffffffff910;
  Float in_stack_fffffffffffff914;
  undefined1 local_6b0 [128];
  undefined1 local_630 [128];
  Tuple2<pbrt::Point2,_int> local_5b0;
  Tuple2<pbrt::Point2,_int> local_5a8;
  undefined8 local_520;
  undefined4 local_518;
  undefined8 local_50c;
  undefined4 local_504;
  CameraBaseParameters local_380;
  Float local_30;
  Float local_2c;
  undefined1 (*local_28) [64];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_8 = vmovlpd_avx(in_ZMM1._0_16_);
  this_00 = &local_380;
  local_30 = in_XMM3_Da;
  local_2c = in_XMM2_Da;
  local_28 = in_RDX;
  CameraBaseParameters::CameraBaseParameters
            ((CameraBaseParameters *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             this_00);
  CameraBase::CameraBase(in_stack_fffffffffffff850,in_RDI);
  auVar1 = vmovdqu64_avx512f(*local_28);
  auVar2 = vmovdqu64_avx512f(local_28[1]);
  auVar2 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])(in_RDI[1].cameraTransform.renderFromCamera.startTransform.mInv.m + 3) =
       auVar2;
  auVar2 = vmovdqu64_avx512f(auVar1);
  *(undefined1 (*) [64])(in_RDI[1].cameraTransform.renderFromCamera.startTransform.m.m + 3) = auVar2
  ;
  Transform::Transform((Transform *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  Transform::Transform((Transform *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  Transform::Transform((Transform *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  in_RDI[1].cameraTransform.renderFromCamera.c3[0].ky = local_2c;
  in_RDI[1].cameraTransform.renderFromCamera.c3[0].kz = local_30;
  Scale(in_stack_fffffffffffff914,in_stack_fffffffffffff910,in_stack_fffffffffffff90c);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
             (float)((ulong)this_00 >> 0x20),SUB84(this_00,0),0.0);
  local_518 = local_504;
  local_520 = local_50c;
  delta.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff910;
  delta.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff90c;
  delta.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff914;
  Translate(delta);
  Transform::operator*(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  local_5a8 = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)this_00);
  local_5b0 = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)this_00);
  Scale(in_stack_fffffffffffff914,in_stack_fffffffffffff910,in_stack_fffffffffffff90c);
  Transform::operator*(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  memcpy(&in_RDI[1].cameraTransform.renderFromCamera.R[0].w,local_630,0x80);
  Inverse((Transform *)in_stack_fffffffffffff850);
  memcpy(in_RDI[1].cameraTransform.renderFromCamera.S[1].m[2] + 3,local_6b0,0x80);
  Inverse((Transform *)in_stack_fffffffffffff850);
  Transform::operator*(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  memcpy(in_RDI[1].cameraTransform.renderFromCamera.endTransform.m.m + 3,&stack0xfffffffffffff8d0,
         0x80);
  return;
}

Assistant:

ProjectiveCamera(CameraBaseParameters baseParameters,
                     const Transform &screenFromCamera, Bounds2f screenWindow,
                     Float lensRadius, Float focalDistance)
        : CameraBase(baseParameters),
          screenFromCamera(screenFromCamera),
          lensRadius(lensRadius),
          focalDistance(focalDistance) {
        // Compute projective camera transformations
        // Compute projective camera screen transformations
        Transform NDCFromScreen =
            Scale(1 / (screenWindow.pMax.x - screenWindow.pMin.x),
                  1 / (screenWindow.pMax.y - screenWindow.pMin.y), 1) *
            Translate(Vector3f(-screenWindow.pMin.x, -screenWindow.pMax.y, 0));
        Transform rasterFromNDC =
            Scale(film.FullResolution().x, -film.FullResolution().y, 1);
        rasterFromScreen = rasterFromNDC * NDCFromScreen;
        screenFromRaster = Inverse(rasterFromScreen);

        cameraFromRaster = Inverse(screenFromCamera) * screenFromRaster;
    }